

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O2

SourceLibrary * __thiscall
slang::driver::SourceLoader::getOrAddLibrary(SourceLoader *this,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  _Alloc_hider __p;
  __type_conflict2 _Var6;
  uint uVar7;
  uint64_t hash;
  byte bVar8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
  *this_00;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong pos0;
  SourceLibrary *pSVar13;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  string nameStr;
  undefined4 local_d4;
  SourceLoader *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong local_a8;
  ulong local_a0;
  uint64_t local_98;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
  *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_68._M_str = name._M_str;
  local_68._M_len = name._M_len;
  if (local_68._M_len == 0) {
    pSVar13 = (SourceLibrary *)0x0;
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_88,&local_68,(allocator<char> *)&local_c8);
    this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
               *)&this->libraries;
    hash = detail::hashing::hash(local_88._M_dataplus._M_p,local_88._M_string_length);
    pos0 = hash >> ((byte)(this->libraries).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
                          .arrays.groups_size_index & 0x3f);
    lVar11 = (hash & 0xff) * 4;
    uVar15 = (&UNK_0042856c)[lVar11];
    uVar16 = (&UNK_0042856d)[lVar11];
    uVar17 = (&UNK_0042856e)[lVar11];
    bVar18 = (&UNK_0042856f)[lVar11];
    uVar9 = ZEXT48((uint)hash & 7);
    uVar10 = 0;
    uVar12 = pos0;
    uVar19 = uVar15;
    uVar20 = uVar16;
    uVar21 = uVar17;
    bVar22 = bVar18;
    uVar23 = uVar15;
    uVar24 = uVar16;
    uVar25 = uVar17;
    bVar26 = bVar18;
    uVar27 = uVar15;
    uVar28 = uVar16;
    uVar29 = uVar17;
    bVar30 = bVar18;
    local_d0 = this;
    do {
      pgVar2 = (this->libraries).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
               .arrays.groups_;
      pgVar1 = pgVar2 + uVar12;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bVar8 = pgVar1->m[0xf].n;
      auVar14[0] = -(local_48 == uVar15);
      auVar14[1] = -(uStack_47 == uVar16);
      auVar14[2] = -(uStack_46 == uVar17);
      auVar14[3] = -(bStack_45 == bVar18);
      auVar14[4] = -(uStack_44 == uVar19);
      auVar14[5] = -(uStack_43 == uVar20);
      auVar14[6] = -(uStack_42 == uVar21);
      auVar14[7] = -(bStack_41 == bVar22);
      auVar14[8] = -(uStack_40 == uVar23);
      auVar14[9] = -(uStack_3f == uVar24);
      auVar14[10] = -(uStack_3e == uVar25);
      auVar14[0xb] = -(bStack_3d == bVar26);
      auVar14[0xc] = -(uStack_3c == uVar27);
      auVar14[0xd] = -(uStack_3b == uVar28);
      auVar14[0xe] = -(uStack_3a == uVar29);
      auVar14[0xf] = -(bVar8 == bVar30);
      uVar7 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      bStack_39 = bVar8;
      if (uVar7 != 0) {
        ppVar3 = (this->libraries).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
                 .arrays.elements_;
        local_c8.field_2._8_8_ = uVar9;
        local_a8 = uVar12;
        local_a0 = uVar10;
        local_98 = hash;
        local_90 = this_00;
        local_58 = uVar15;
        uStack_57 = uVar16;
        uStack_56 = uVar17;
        bStack_55 = bVar18;
        uStack_54 = uVar19;
        uStack_53 = uVar20;
        uStack_52 = uVar21;
        bStack_51 = bVar22;
        uStack_50 = uVar23;
        uStack_4f = uVar24;
        uStack_4e = uVar25;
        bStack_4d = bVar26;
        uStack_4c = uVar27;
        uStack_4b = uVar28;
        uStack_4a = uVar29;
        bStack_49 = bVar30;
        do {
          uVar5 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar9 = ppVar3 + uVar12 * 0xf + (ulong)uVar5;
          _Var6 = std::operator==(&local_88,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)uVar9);
          if (_Var6) goto LAB_001c2b37;
          uVar7 = uVar7 - 1 & uVar7;
        } while (uVar7 != 0);
        bVar8 = pgVar2[uVar12].m[0xf].n;
        hash = local_98;
        this = local_d0;
        this_00 = local_90;
        uVar10 = local_a0;
        uVar12 = local_a8;
        uVar9 = local_c8.field_2._8_8_;
        uVar15 = local_58;
        uVar16 = uStack_57;
        uVar17 = uStack_56;
        bVar18 = bStack_55;
        uVar19 = uStack_54;
        uVar20 = uStack_53;
        uVar21 = uStack_52;
        bVar22 = bStack_51;
        uVar23 = uStack_50;
        uVar24 = uStack_4f;
        uVar25 = uStack_4e;
        bVar26 = bStack_4d;
        uVar27 = uStack_4c;
        uVar28 = uStack_4b;
        uVar29 = uStack_4a;
        bVar30 = bStack_49;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar9] & bVar8) == 0) break;
      uVar4 = (this->libraries).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
              .arrays.groups_size_mask;
      lVar11 = uVar12 + uVar10;
      uVar10 = uVar10 + 1;
      uVar12 = lVar11 + 1U & uVar4;
    } while (uVar10 <= uVar4);
    if ((this->libraries).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
        .size_ctrl.size <
        (this->libraries).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string_const&>
                ((locator *)&local_c8,this_00,pos0,hash,(try_emplace_args_t *)&local_d4,&local_88);
      uVar9 = local_c8.field_2._M_allocated_capacity;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string_const&>
                ((locator *)&local_c8,this_00,hash,(try_emplace_args_t *)&local_d4,&local_88);
      uVar9 = local_c8.field_2._M_allocated_capacity;
    }
LAB_001c2b37:
    pSVar13 = (((value_type_pointer)uVar9)->second)._M_t.
              super___uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::SourceLibrary_*,_std::default_delete<slang::SourceLibrary>_>
              .super__Head_base<0UL,_slang::SourceLibrary_*,_false>._M_head_impl;
    if (pSVar13 == (SourceLibrary *)0x0) {
      local_d4 = (undefined4)
                 (local_d0->libraries).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
                 .size_ctrl.size;
      std::make_unique<slang::SourceLibrary,std::__cxx11::string,int>(&local_c8,(int *)&local_88);
      __p._M_p = local_c8._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>::reset
                ((__uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
                  *)&((value_type_pointer)uVar9)->second,(pointer)__p._M_p);
      std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>::~unique_ptr
                ((unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_> *)
                 &local_c8);
      pSVar13 = (((value_type_pointer)uVar9)->second)._M_t.
                super___uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::SourceLibrary_*,_std::default_delete<slang::SourceLibrary>_>
                .super__Head_base<0UL,_slang::SourceLibrary_*,_false>._M_head_impl;
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  return pSVar13;
}

Assistant:

SourceLibrary* SourceLoader::getOrAddLibrary(std::string_view name) {
    if (name.empty())
        return nullptr;

    auto nameStr = std::string(name);
    auto& lib = libraries[nameStr];
    if (!lib)
        lib = std::make_unique<SourceLibrary>(std::move(nameStr), (int)libraries.size());

    return lib.get();
}